

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

void __thiscall
testing::internal::StreamingListener::SocketWriter::MakeConnection(SocketWriter *this)

{
  int iVar1;
  char *__s;
  size_t sVar2;
  ostream *poVar3;
  addrinfo *paVar4;
  addrinfo local_68;
  addrinfo *local_30;
  addrinfo *servinfo;
  
  if (this->sockfd_ != -1) {
    GTestLog::GTestLog((GTestLog *)&local_68,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/inani47[P]8-puzzle-BFS/vendor/googletest/googletest/src/gtest.cc"
                       ,0xec5);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Condition sockfd_ == -1 failed. ",0x20);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "MakeConnection() can\'t be called when there is already a connection.",0x44);
    GTestLog::~GTestLog((GTestLog *)&local_68);
  }
  local_68.ai_flags = 0;
  local_68.ai_family = 0;
  local_68.ai_canonname = (char *)0x0;
  local_68.ai_next = (addrinfo *)0x0;
  local_68.ai_addrlen = 0;
  local_68._20_4_ = 0;
  local_68.ai_addr = (sockaddr *)0x0;
  local_68.ai_socktype = 1;
  local_68.ai_protocol = 0;
  local_30 = (addrinfo *)0x0;
  iVar1 = getaddrinfo((this->host_name_)._M_dataplus._M_p,(this->port_num_)._M_dataplus._M_p,
                      &local_68,&local_30);
  if (iVar1 != 0) {
    GTestLog::GTestLog((GTestLog *)((long)&servinfo + 4),GTEST_WARNING,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/inani47[P]8-puzzle-BFS/vendor/googletest/googletest/src/gtest.cc"
                       ,0xed3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"stream_result_to: getaddrinfo() failed: ",0x28);
    __s = gai_strerror(iVar1);
    if (__s == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x14d560);
    }
    else {
      sVar2 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,__s,sVar2);
    }
    GTestLog::~GTestLog((GTestLog *)((long)&servinfo + 4));
  }
  paVar4 = local_30;
  if (local_30 != (addrinfo *)0x0 && this->sockfd_ == -1) {
    do {
      iVar1 = socket(paVar4->ai_family,paVar4->ai_socktype,paVar4->ai_protocol);
      this->sockfd_ = iVar1;
      if (iVar1 != -1) {
        iVar1 = connect(iVar1,paVar4->ai_addr,paVar4->ai_addrlen);
        if (iVar1 == -1) {
          close(this->sockfd_);
          this->sockfd_ = -1;
        }
      }
    } while ((this->sockfd_ == -1) && (paVar4 = paVar4->ai_next, paVar4 != (addrinfo *)0x0));
  }
  freeaddrinfo(local_30);
  if (this->sockfd_ == -1) {
    GTestLog::GTestLog((GTestLog *)((long)&servinfo + 4),GTEST_WARNING,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/inani47[P]8-puzzle-BFS/vendor/googletest/googletest/src/gtest.cc"
                       ,0xee8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"stream_result_to: failed to connect to ",0x27);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(this->host_name_)._M_dataplus._M_p,
                        (this->host_name_)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,":",1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,(this->port_num_)._M_dataplus._M_p,(this->port_num_)._M_string_length);
    GTestLog::~GTestLog((GTestLog *)((long)&servinfo + 4));
  }
  return;
}

Assistant:

void StreamingListener::SocketWriter::MakeConnection() {
  GTEST_CHECK_(sockfd_ == -1)
      << "MakeConnection() can't be called when there is already a connection.";

  addrinfo hints;
  memset(&hints, 0, sizeof(hints));
  hints.ai_family = AF_UNSPEC;    // To allow both IPv4 and IPv6 addresses.
  hints.ai_socktype = SOCK_STREAM;
  addrinfo* servinfo = NULL;

  // Use the getaddrinfo() to get a linked list of IP addresses for
  // the given host name.
  const int error_num = getaddrinfo(
      host_name_.c_str(), port_num_.c_str(), &hints, &servinfo);
  if (error_num != 0) {
    GTEST_LOG_(WARNING) << "stream_result_to: getaddrinfo() failed: "
                        << gai_strerror(error_num);
  }

  // Loop through all the results and connect to the first we can.
  for (addrinfo* cur_addr = servinfo; sockfd_ == -1 && cur_addr != NULL;
       cur_addr = cur_addr->ai_next) {
    sockfd_ = socket(
        cur_addr->ai_family, cur_addr->ai_socktype, cur_addr->ai_protocol);
    if (sockfd_ != -1) {
      // Connect the client socket to the server socket.
      if (connect(sockfd_, cur_addr->ai_addr, cur_addr->ai_addrlen) == -1) {
        close(sockfd_);
        sockfd_ = -1;
      }
    }
  }

  freeaddrinfo(servinfo);  // all done with this structure

  if (sockfd_ == -1) {
    GTEST_LOG_(WARNING) << "stream_result_to: failed to connect to "
                        << host_name_ << ":" << port_num_;
  }
}